

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_second_step1.cpp
# Opt level: O0

bool __thiscall
ruckig::PositionSecondOrderStep1::time_all_single_step
          (PositionSecondOrderStep1 *this,Profile *profile,double vMax,double vMin,double aMax,
          double aMin)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  reference pvVar4;
  int __x;
  Profile *pPVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  Profile *profile_local;
  PositionSecondOrderStep1 *this_local;
  
  std::abs((int)this);
  if (extraout_XMM0_Qa <= 2.220446049250313e-16) {
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,0);
    *pvVar4 = 0.0;
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,1);
    *pvVar4 = 0.0;
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,2);
    *pvVar4 = 0.0;
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,3);
    *pvVar4 = 0.0;
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,4);
    *pvVar4 = 0.0;
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,5);
    *pvVar4 = 0.0;
    pPVar5 = profile;
    pvVar4 = std::array<double,_7UL>::operator[](&profile->t,6);
    *pvVar4 = 0.0;
    __x = (int)pPVar5;
    std::abs(__x);
    if (extraout_XMM0_Qa_00 <= 2.220446049250313e-16) {
      std::abs(__x);
      if ((extraout_XMM0_Qa_01 < 2.220446049250313e-16) &&
         (bVar3 = Profile::
                  check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                            (profile,0.0,0.0,vMax,vMin), bVar3)) {
        return true;
      }
    }
    else {
      dVar1 = this->pd;
      dVar2 = this->v0;
      pvVar4 = std::array<double,_7UL>::operator[](&profile->t,3);
      *pvVar4 = dVar1 / dVar2;
      bVar3 = Profile::
              check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                        (profile,0.0,0.0,vMax,vMin);
      if (bVar3) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool PositionSecondOrderStep1::time_all_single_step(Profile* profile, double vMax, double vMin, double aMax, double aMin) const {
    if (std::abs(vf - v0) > DBL_EPSILON) {
        return false;
    }

    profile->t[0] = 0;
    profile->t[1] = 0;
    profile->t[2] = 0;
    profile->t[3] = 0;
    profile->t[4] = 0;
    profile->t[5] = 0;
    profile->t[6] = 0;

    if (std::abs(v0) > DBL_EPSILON) {
        profile->t[3] = pd / v0;
        if (profile->check_for_second_order<ControlSigns::UDDU, ReachedLimits::NONE>(0.0, 0.0, vMax, vMin)) {
            return true;
        }

    } else if (std::abs(pd) < DBL_EPSILON) {
        if (profile->check_for_second_order<ControlSigns::UDDU, ReachedLimits::NONE>(0.0, 0.0, vMax, vMin)) {
            return true;
        }
    }

    return false;
}